

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O3

void __thiscall RigidBodyDynamics::Model::Model(Model *this)

{
  pointer *ppSVar1;
  _Rb_tree_header *p_Var2;
  pointer *ppMVar3;
  pointer *ppMVar4;
  pointer *ppVVar5;
  pointer *ppSVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  mapped_type *pmVar10;
  long lVar11;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  Body root_body;
  SpatialVector_t local_348;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_310;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_308;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_300;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_2f8;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_2f0;
  vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *local_2e8;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_2e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2d8;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *local_2d0;
  vector<Matrix3_t,_std::allocator<Matrix3_t>_> *local_2c8;
  vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
  *local_2c0;
  vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
  *local_2b8;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_2b0;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_2a8;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_2a0;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_298;
  vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_288;
  vector<RigidBodyDynamics::Body,_std::allocator<RigidBodyDynamics::Body>_> *local_280;
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  *local_278;
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  *local_270;
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_std::allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  *local_268;
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_std::allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  *local_260;
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  *local_258;
  vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  *local_250;
  vector<RigidBodyDynamics::Joint,_std::allocator<RigidBodyDynamics::Joint>_> *local_248;
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  *local_240;
  value_type local_238;
  undefined1 local_218 [32];
  double local_1f8;
  double dStack_1f0;
  double dStack_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double dStack_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_1a0;
  double dStack_198;
  double local_190;
  double dStack_188;
  double local_180;
  double dStack_178;
  double local_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double local_110;
  double dStack_108;
  double local_100;
  value_type local_f8;
  value_type local_88;
  
  local_288 = &this->lambda_q;
  local_240 = (vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
               *)&this->mu;
  local_290 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->v;
  local_298 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->a;
  local_248 = &this->mJoints;
  local_2a0 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->S;
  local_258 = &this->X_J;
  local_2a8 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->v_J;
  local_2b0 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->c_J;
  local_250 = &this->X_T;
  local_2b8 = (vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
               *)&this->multdof3_S;
  local_2c0 = (vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
               *)&this->multdof3_U;
  local_2c8 = &this->multdof3_Dinv;
  (this->mBodies).
  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBodies).
  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBodies).
  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mu).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mu).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mu).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d0 = &this->multdof3_u;
  local_2d8 = &this->multdof3_w_index;
  local_2e0 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->c;
  local_2e8 = &this->IA;
  local_2f0 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->pA;
  local_2f8 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->U;
  local_300 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->f;
  local_268 = &this->I;
  local_260 = &this->Ic;
  local_308 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->hc;
  local_310 = (vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->hdotc;
  local_270 = &this->X_lambda;
  local_278 = &this->X_base;
  local_280 = &this->mBodies;
  p_Var2 = &(this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header;
  memset(local_290,0,0x2c0);
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[8]._0_1_ = 0;
  local_f8._97_8_ = 0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[6] = 0.0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7]._0_1_ = 0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7]._1_7_ = 0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[4] = 0.0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[5] = 0.0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] = 0.0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] = 0.0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  local_f8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[1] = 0.0;
  local_f8.mCenterOfMass.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[1] = 0.0;
  local_f8.mCenterOfMass.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[2] = 0.0;
  local_f8.mMass = 0.0;
  local_f8.mCenterOfMass.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[0] = 0.0;
  local_238.mJointAxes = (SpatialVector *)0x0;
  local_238.mJointType = JointTypeUndefined;
  local_238.mDoFCount = 0;
  local_238.q_index = 0;
  local_238.custom_joint_index = 0xffffffff;
  local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_218._0_4_ = 0;
  iVar7._M_current =
       (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->lambda,iVar7,(uint *)local_218);
  }
  else {
    *iVar7._M_current = 0;
    (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar7._M_current + 1;
  }
  local_218._0_8_ = (ulong)(uint)local_218._4_4_ << 0x20;
  iVar7._M_current =
       (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (local_288,iVar7,(uint *)local_218);
  }
  else {
    *iVar7._M_current = 0;
    (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar7._M_current + 1;
  }
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (local_240,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218);
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
  }
  this->dof_count = 0;
  this->q_size = 0;
  this->qdot_size = 0;
  this->previously_added_body_id = 0;
  (this->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  (this->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = -9.81;
  (this->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] = 0.0;
  iVar8._M_current =
       (this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_290,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  iVar8._M_current =
       (this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_298,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
  push_back(&local_248->
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ,&local_238);
  iVar8._M_current =
       (this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_2a0,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_218._0_8_ = (pointer)0x3ff0000000000000;
  local_218._8_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._24_8_ = 0.0;
  local_1f8 = 1.0;
  dStack_1f0 = 0.0;
  dStack_1e8 = 0.0;
  dStack_1e0 = 0.0;
  local_1d8 = 1.0;
  dStack_1d0 = 0.0;
  dStack_1c8 = 0.0;
  dStack_1c0 = 0.0;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
            (&local_250->
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ,(SpatialTransform *)local_218);
  local_218._0_8_ = (pointer)0x3ff0000000000000;
  local_218._8_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._24_8_ = 0.0;
  local_1f8 = 1.0;
  dStack_1f0 = 0.0;
  dStack_1e8 = 0.0;
  dStack_1e0 = 0.0;
  local_1d8 = 1.0;
  dStack_1d0 = 0.0;
  dStack_1c8 = 0.0;
  dStack_1c0 = 0.0;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
            (&local_258->
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ,(SpatialTransform *)local_218);
  iVar8._M_current =
       (this->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_2a8,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
               .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  iVar8._M_current =
       (this->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_2b0,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
               .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  memset(local_218,0,0x90);
  iVar9._M_current =
       (this->multdof3_S).
       super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
       .
       super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar9._M_current ==
      (this->multdof3_S).
      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,6,3,0,6,3>>
              (local_2b8,iVar9,(Matrix<double,_6,_3,_0,_6,_3> *)local_218);
  }
  else {
    memset(iVar9._M_current,0,0x90);
    ppMVar3 = &(this->multdof3_S).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar3 = *ppMVar3 + 1;
  }
  memset(local_218,0,0x90);
  iVar9._M_current =
       (this->multdof3_U).
       super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
       .
       super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar9._M_current ==
      (this->multdof3_U).
      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,6,3,0,6,3>>
              (local_2c0,iVar9,(Matrix<double,_6,_3,_0,_6,_3> *)local_218);
  }
  else {
    memset(iVar9._M_current,0,0x90);
    ppMVar3 = &(this->multdof3_U).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar3 = *ppMVar3 + 1;
  }
  dStack_1e8 = 0.0;
  dStack_1e0 = 0.0;
  local_1f8 = 0.0;
  dStack_1f0 = 0.0;
  local_218._16_8_ = (pointer)0x0;
  local_218._24_8_ = 0.0;
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (pointer)0x0;
  local_1d8 = 0.0;
  __position._M_current =
       (this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::_M_realloc_insert<Matrix3_t>
              (local_2c8,__position,(Matrix3_t *)local_218);
  }
  else {
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    ((__position._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    ppMVar4 = &(this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppMVar4 = *ppMVar4 + 1;
  }
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  __position_00._M_current =
       (this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_realloc_insert<Vector3_t>
              (local_2d0,__position_00,(Vector3_t *)local_218);
  }
  else {
    ((__position_00._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
    ((__position_00._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
    ((__position_00._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
    ppVVar5 = &(this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppVVar5 = *ppVVar5 + 1;
  }
  local_218._0_8_ = local_218._0_8_ & 0xffffffff00000000;
  iVar7._M_current =
       (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (local_2d8,iVar7,(uint *)local_218);
  }
  else {
    *iVar7._M_current = 0;
    (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = iVar7._M_current + 1;
  }
  iVar8._M_current =
       (this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_2e0,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_218._0_8_ = (pointer)0x3ff0000000000000;
  local_218._8_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._24_8_ = 0.0;
  local_1f8 = 0.0;
  dStack_1f0 = 0.0;
  dStack_1e8 = 0.0;
  dStack_1e0 = 1.0;
  local_1d8 = 0.0;
  dStack_1d0 = 0.0;
  dStack_1c8 = 0.0;
  dStack_1c0 = 0.0;
  local_1b8 = 0.0;
  dStack_1b0 = 0.0;
  local_1a8 = 1.0;
  local_1a0 = 0.0;
  dStack_198 = 0.0;
  local_190 = 0.0;
  dStack_188 = 0.0;
  local_180 = 0.0;
  dStack_178 = 0.0;
  local_170 = 1.0;
  local_168 = 0.0;
  dStack_160 = 0.0;
  local_158 = 0.0;
  dStack_150 = 0.0;
  local_148 = 0.0;
  dStack_140 = 0.0;
  local_138 = 1.0;
  local_110 = 0.0;
  dStack_108 = 0.0;
  local_120 = 0.0;
  dStack_118 = 0.0;
  local_130 = 0.0;
  dStack_128 = 0.0;
  local_100 = 1.0;
  __position_01._M_current =
       (this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
       super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::
    _M_realloc_insert<SpatialMatrix_t>
              (&local_2e8->super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
               ,__position_01,(SpatialMatrix_t *)local_218);
  }
  else {
    memcpy(__position_01._M_current,local_218,0x120);
    ppSVar6 = &(this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
               super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar6 = *ppSVar6 + 1;
  }
  iVar8._M_current =
       (this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_2f0,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  iVar8._M_current =
       (this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_2f8,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  lVar11 = 1;
  if ((this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 1
     ) {
LAB_0017c612:
    memset((this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           ,0,lVar11 << 3);
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1,1);
    lVar11 = (this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (0 < lVar11) goto LAB_0017c612;
  }
  lVar11 = 1;
  if ((this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 1
     ) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1,1);
    lVar11 = (this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (lVar11 < 1) goto LAB_0017c657;
  }
  memset((this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0
         ,lVar11 << 3);
LAB_0017c657:
  iVar8._M_current =
       (this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_300,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_88.Izy = 0.0;
  local_88.Izz = 0.0;
  local_88.Iyy = 0.0;
  local_88.Izx = 0.0;
  local_88.Ixx = 0.0;
  local_88.Iyx = 0.0;
  local_88.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_88.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  local_88.m = 0.0;
  local_88.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back(&local_260->
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
              ,&local_88);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back(&local_268->
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
              ,&local_88);
  iVar8._M_current =
       (this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_308,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  iVar8._M_current =
       (this->hdotc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->hdotc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>(local_310,iVar8,&local_348);
  }
  else {
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    ((iVar8._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_348.super_Matrix<double,_6,_1,_0,_6,_1>.
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    ppSVar1 = &(this->hdotc).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  local_218._0_8_ = (pointer)0x3ff0000000000000;
  local_218._8_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._24_8_ = 0.0;
  local_1f8 = 1.0;
  dStack_1f0 = 0.0;
  dStack_1e8 = 0.0;
  dStack_1e0 = 0.0;
  local_1d8 = 1.0;
  dStack_1d0 = 0.0;
  dStack_1c8 = 0.0;
  dStack_1c0 = 0.0;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
            (&local_270->
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ,(SpatialTransform *)local_218);
  local_218._0_8_ = (pointer)0x3ff0000000000000;
  local_218._8_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_218._24_8_ = 0.0;
  local_1f8 = 1.0;
  dStack_1f0 = 0.0;
  dStack_1e8 = 0.0;
  dStack_1e0 = 0.0;
  local_1d8 = 1.0;
  dStack_1d0 = 0.0;
  dStack_1c8 = 0.0;
  dStack_1c0 = 0.0;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
            (&local_278->
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ,(SpatialTransform *)local_218);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  push_back(&local_280->
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ,&local_f8);
  local_218._0_8_ = local_218 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"ROOT","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::operator[](&this->mBodyNameMap,(key_type *)local_218);
  *pmVar10 = 0;
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  this->fixed_body_discriminator = 0x7fffffff;
  if (local_238.mJointAxes != (SpatialVector *)0x0) {
    operator_delete__(local_238.mJointAxes);
  }
  return;
}

Assistant:

Model::Model()
{
  Body root_body;
  Joint root_joint;

  Vector3d zero_position (0., 0., 0.);
  SpatialVector zero_spatial (0., 0., 0., 0., 0., 0.);

  // structural information
  lambda.push_back(0);
  lambda_q.push_back(0);
  mu.push_back(std::vector<unsigned int>());
  dof_count = 0;
  q_size = 0;
  qdot_size = 0;
  previously_added_body_id = 0;

  gravity = Vector3d (0., -9.81, 0.);

  // state information
  v.push_back(zero_spatial);
  a.push_back(zero_spatial);

  // Joints
  mJoints.push_back(root_joint);
  S.push_back (zero_spatial);
  X_T.push_back(SpatialTransform());

  X_J.push_back (SpatialTransform());
  v_J.push_back (zero_spatial);
  c_J.push_back (zero_spatial);

  // Spherical joints
  multdof3_S.push_back (Matrix63::Zero());
  multdof3_U.push_back (Matrix63::Zero());
  multdof3_Dinv.push_back (Matrix3d::Zero());
  multdof3_u.push_back (Vector3d::Zero());
  multdof3_w_index.push_back (0);

  // Dynamic variables
  c.push_back(zero_spatial);
  IA.push_back(SpatialMatrix::Identity());
  pA.push_back(zero_spatial);
  U.push_back(zero_spatial);

  u = VectorNd::Zero(1);
  d = VectorNd::Zero(1);

  f.push_back (zero_spatial);
  SpatialRigidBodyInertia rbi(0.,
                              Vector3d (0., 0., 0.),
                              Matrix3d::Zero());
  Ic.push_back (rbi);
  I.push_back(rbi);
  hc.push_back (zero_spatial);
  hdotc.push_back (zero_spatial);

  // Bodies
  X_lambda.push_back(SpatialTransform());
  X_base.push_back(SpatialTransform());

  mBodies.push_back(root_body);
  mBodyNameMap["ROOT"] = 0;

  fixed_body_discriminator = std::numeric_limits<unsigned int>::max() / 2;
}